

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int find_lexical_decl(JSContext *ctx,JSFunctionDef *fd,JSAtom name,int scope_idx,
                     BOOL check_catch_var)

{
  uint uVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  
  if (-1 < (int)name) {
    uVar3 = (ulong)name;
    lVar4 = (ctx->promise_ctor).tag;
    do {
      lVar5 = lVar4 + uVar3 * 0x10;
      if (*(int *)(lVar4 + uVar3 * 0x10) == (int)fd) {
        uVar1 = *(uint *)(lVar5 + 0xc);
        if ((uVar1 & 2) != 0) {
          return (int)uVar3;
        }
        if ((scope_idx != 0) && ((uVar1 & 0x78) == 0x18)) {
          return (int)uVar3;
        }
      }
      uVar1 = *(uint *)(lVar5 + 8);
      uVar3 = (ulong)uVar1;
    } while (-1 < (int)uVar1);
  }
  if ((*(int *)&ctx->array_shape != 0) && (*(int *)((long)&ctx->array_shape + 4) == 0)) {
    lVar4 = (long)*(int *)((long)&(ctx->iterator_proto).u + 4);
    if (0 < lVar4) {
      pvVar2 = (ctx->async_iterator_proto).u.ptr;
      lVar5 = 0;
      do {
        if (*(int *)((long)pvVar2 + lVar5 + 0xc) == (int)fd) {
          if ((*(byte *)((long)pvVar2 + lVar5 + 4) & 2) == 0) {
            return -1;
          }
          return 0x40000000;
        }
        lVar5 = lVar5 + 0x10;
      } while (lVar4 * 0x10 != lVar5);
    }
    return -1;
  }
  return -1;
}

Assistant:

static int find_lexical_decl(JSContext *ctx, JSFunctionDef *fd, JSAtom name,
                             int scope_idx, BOOL check_catch_var)
{
    while (scope_idx >= 0) {
        JSVarDef *vd = &fd->vars[scope_idx];
        if (vd->var_name == name &&
            (vd->is_lexical || (vd->var_kind == JS_VAR_CATCH &&
                                check_catch_var)))
            return scope_idx;
        scope_idx = vd->scope_next;
    }

    if (fd->is_eval && fd->eval_type == JS_EVAL_TYPE_GLOBAL) {
        if (find_lexical_global_var(fd, name))
            return GLOBAL_VAR_OFFSET;
    }
    return -1;
}